

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * luaH_setstr(lua_State *L,Table *t,TString *key)

{
  TValue *i_o;
  TValue k;
  TValue *p;
  TString *key_local;
  Table *t_local;
  lua_State *L_local;
  
  k._8_8_ = luaH_getstr(t,key);
  L_local = (lua_State *)k._8_8_;
  if ((TValue *)k._8_8_ == &luaO_nilobject_) {
    k.value.b = 4;
    i_o = (TValue *)key;
    L_local = (lua_State *)newkey(L,t,(TValue *)&i_o);
  }
  return (TValue *)L_local;
}

Assistant:

static TValue*luaH_setstr(lua_State*L,Table*t,TString*key){
const TValue*p=luaH_getstr(t,key);
if(p!=(&luaO_nilobject_))
return cast(TValue*,p);
else{
TValue k;
setsvalue(L,&k,key);
return newkey(L,t,&k);
}
}